

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QDBusPlatformMenuItem_*>::reallocateAndGrow
          (QArrayDataPointer<QDBusPlatformMenuItem_*> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QDBusPlatformMenuItem_*> *old)

{
  long lVar1;
  bool bVar2;
  QPodArrayOps<QDBusPlatformMenuItem_*> *this_00;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  QArrayDataPointer<QDBusPlatformMenuItem_*> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QDBusPlatformMenuItem_*> dp;
  undefined4 in_stack_ffffffffffffff78;
  AllocationOption in_stack_ffffffffffffff7c;
  QArrayDataPointer<QDBusPlatformMenuItem_*> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QDBusPlatformMenuItem_*> *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((in_ESI != 0) || (in_RCX != 0)) || (bVar2 = needsDetach(in_stack_ffffffffffffff80), bVar2))
     || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QDBusPlatformMenuItem_*> *)&DAT_aaaaaaaaaaaaaaaa,
                 -0x5555555555555556,0xaaaaaaaa);
    if (0 < in_RDX) {
      qt_noop();
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach(in_stack_ffffffffffffff80);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QPodArrayOps<QDBusPlatformMenuItem_*> *)
                  operator->((QArrayDataPointer<QDBusPlatformMenuItem_*> *)&stack0xffffffffffffffe0)
        ;
        begin((QArrayDataPointer<QDBusPlatformMenuItem_*> *)0xb1f61c);
        begin((QArrayDataPointer<QDBusPlatformMenuItem_*> *)0xb1f62b);
        QtPrivate::QPodArrayOps<QDBusPlatformMenuItem_*>::copyAppend
                  (this_00,(QDBusPlatformMenuItem **)in_stack_ffffffffffffff88,
                   (QDBusPlatformMenuItem **)in_stack_ffffffffffffff80);
      }
      else {
        in_stack_ffffffffffffff80 =
             (QArrayDataPointer<QDBusPlatformMenuItem_*> *)
             operator->((QArrayDataPointer<QDBusPlatformMenuItem_*> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QDBusPlatformMenuItem_*> *)0xb1f664);
        begin((QArrayDataPointer<QDBusPlatformMenuItem_*> *)0xb1f673);
        QtPrivate::QPodArrayOps<QDBusPlatformMenuItem_*>::moveAppend
                  ((QPodArrayOps<QDBusPlatformMenuItem_*> *)in_stack_ffffffffffffff80,
                   (QDBusPlatformMenuItem **)
                   CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (QDBusPlatformMenuItem **)0xb1f691);
      }
    }
    swap(in_stack_ffffffffffffff80,
         (QArrayDataPointer<QDBusPlatformMenuItem_*> *)
         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (in_RCX != 0) {
      swap(in_stack_ffffffffffffff80,
           (QArrayDataPointer<QDBusPlatformMenuItem_*> *)
           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    ~QArrayDataPointer(in_stack_ffffffffffffff80);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity(in_stack_ffffffffffffff80);
    freeSpaceAtEnd(in_stack_ffffffffffffff88);
    QtPrivate::QPodArrayOps<QDBusPlatformMenuItem_*>::reallocate
              ((QPodArrayOps<QDBusPlatformMenuItem_*> *)in_stack_ffffffffffffff88,
               (qsizetype)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }